

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmGhsMultiTargetGenerator::WriteCustomCommandsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmCustomCommandGenerator *ccg)

{
  pointer pbVar1;
  bool bVar2;
  uint uVar3;
  string *psVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  char cVar9;
  uint c_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  string suffix;
  string cdCmd;
  string cmd;
  string workingDir;
  string dir;
  string cdStr;
  string check_error;
  string currentBinDir;
  string local_70;
  string local_50;
  
  cmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  cmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmdLines.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  std::__cxx11::string::string((string *)&dir,(string *)psVar4);
  std::__cxx11::string::string((string *)&currentBinDir,(string *)&dir);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&workingDir,ccg);
  if (workingDir._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&dir);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&check_error,"if [[ $? -ne 0 ]]; then exit 1; fi",(allocator<char> *)&cdCmd);
  pcVar5 = cmCustomCommandGenerator::GetComment(ccg);
  if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cdCmd,"echo ",(allocator<char> *)&cdStr);
    std::__cxx11::string::append((char *)&cdCmd);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdLines,&cdCmd
              );
    std::__cxx11::string::~string((string *)&cdCmd);
  }
  cdCmd._M_dataplus._M_p = (pointer)&cdCmd.field_2;
  cdCmd._M_string_length = 0;
  cdCmd.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&cdStr,"cd ",(allocator<char> *)&cmd)
  ;
  cmOutputConverter::ConvertToOutputFormat
            (&suffix,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,&dir,
             SHELL);
  std::operator+(&cmd,&cdStr,&suffix);
  std::__cxx11::string::operator=((string *)&cdCmd,(string *)&cmd);
  std::__cxx11::string::~string((string *)&cmd);
  std::__cxx11::string::~string((string *)&suffix);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdLines,&cdCmd);
  c_00 = 0;
  do {
    uVar3 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    pbVar1 = cmdLines.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar3 <= c_00) {
      for (pbVar10 = cmdLines.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar10 != pbVar1;
          pbVar10 = pbVar10 + 1) {
        poVar8 = std::operator<<(fout,(string *)pbVar10);
        std::endl<char,std::char_traits<char>>(poVar8);
        poVar8 = std::operator<<(fout,(string *)&check_error);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      std::__cxx11::string::~string((string *)&cdStr);
      std::__cxx11::string::~string((string *)&cdCmd);
      std::__cxx11::string::~string((string *)&check_error);
      std::__cxx11::string::~string((string *)&workingDir);
      std::__cxx11::string::~string((string *)&currentBinDir);
      std::__cxx11::string::~string((string *)&dir);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&cmdLines);
      return;
    }
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&cmd,ccg,c_00);
    if (cmd._M_string_length != 0) {
      if (this->CmdWindowsShell == true) {
        suffix._M_dataplus._M_p = (pointer)&suffix.field_2;
        suffix._M_string_length = 0;
        suffix.field_2._M_local_buf[0] = '\0';
        if (cmd._M_string_length < 5) {
LAB_00216ef3:
          bVar2 = false;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&cmd);
          cmsys::SystemTools::LowerCase(&local_50,&local_70);
          std::__cxx11::string::operator=((string *)&suffix,(string *)&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&local_70);
          bVar2 = std::operator==(&suffix,".bat");
          if (!bVar2) {
            bVar2 = std::operator==(&suffix,".cmd");
            if (!bVar2) goto LAB_00216ef3;
          }
          bVar2 = true;
        }
        std::__cxx11::string::~string((string *)&suffix);
      }
      else {
        bVar2 = false;
      }
      cmsys::SystemTools::ReplaceString(&cmd,"/./","/");
      cVar9 = (char)&cmd;
      lVar6 = std::__cxx11::string::find(cVar9,0x2f);
      if (workingDir._M_string_length == 0) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  (&suffix,&this->LocalGenerator->super_cmLocalGenerator,&currentBinDir,&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&suffix);
        std::__cxx11::string::~string((string *)&suffix);
      }
      lVar7 = std::__cxx11::string::find(cVar9,0x2f);
      if ((lVar6 != -1) && (lVar7 == -1)) {
        std::operator+(&suffix,"./",&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&suffix);
        std::__cxx11::string::~string((string *)&suffix);
      }
      cmOutputConverter::ConvertToOutputFormat
                (&suffix,&(this->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                 &cmd,SHELL);
      std::__cxx11::string::operator=((string *)&cmd,(string *)&suffix);
      std::__cxx11::string::~string((string *)&suffix);
      if (bVar2) {
        std::operator+(&suffix,"call ",&cmd);
        std::__cxx11::string::operator=((string *)&cmd,(string *)&suffix);
        std::__cxx11::string::~string((string *)&suffix);
      }
      cmCustomCommandGenerator::AppendArguments(ccg,c_00,&cmd);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&cmdLines,&cmd
                );
    }
    std::__cxx11::string::~string((string *)&cmd);
    c_00 = c_00 + 1;
  } while( true );
}

Assistant:

void cmGhsMultiTargetGenerator::WriteCustomCommandsHelper(
  std::ostream& fout, cmCustomCommandGenerator const& ccg)
{
  std::vector<std::string> cmdLines;

  // if the command specified a working directory use it.
  std::string dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  std::string currentBinDir = dir;
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }

  // Line to check for error between commands.
#ifdef _WIN32
  std::string check_error = "if %errorlevel% neq 0 exit /b %errorlevel%";
#else
  std::string check_error = "if [[ $? -ne 0 ]]; then exit 1; fi";
#endif

#ifdef _WIN32
  cmdLines.push_back("@echo off");
#endif
  // Echo the custom command's comment text.
  const char* comment = ccg.GetComment();
  if (comment && *comment) {
    std::string echocmd = "echo ";
    echocmd += comment;
    cmdLines.push_back(std::move(echocmd));
  }

  // Switch to working directory
  std::string cdCmd;
#ifdef _WIN32
  std::string cdStr = "cd /D ";
#else
  std::string cdStr = "cd ";
#endif
  cdCmd = cdStr +
    this->LocalGenerator->ConvertToOutputFormat(dir, cmOutputConverter::SHELL);
  cmdLines.push_back(std::move(cdCmd));

  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->CmdWindowsShell) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd =
          this->LocalGenerator->MaybeConvertToRelativePath(currentBinDir, cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = "./" + cmd;
      }
      cmd = this->LocalGenerator->ConvertToOutputFormat(
        cmd, cmOutputConverter::SHELL);
      if (useCall) {
        cmd = "call " + cmd;
      }
      ccg.AppendArguments(c, cmd);
      cmdLines.push_back(std::move(cmd));
    }
  }

  // push back the custom commands
  for (auto const& c : cmdLines) {
    fout << c << std::endl;
    fout << check_error << std::endl;
  }
}